

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_3,_2>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_3,_2>_> *this,EvalContext *ctx)

{
  bool *pbVar1;
  Environment *this_00;
  Variable<tcu::Matrix<float,_3,_2>_> *variable;
  Expr<tcu::Matrix<float,_3,_2>_> *pEVar2;
  double dVar3;
  IVal *pIVar4;
  long lVar5;
  IVal local_b0;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
               .m_ptr;
    pEVar2 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>.
             super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr;
    (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(&local_b0,pEVar2,ctx);
    Environment::bind<tcu::Matrix<float,3,2>>(this_00,variable,&local_b0);
  }
  else {
    pEVar2 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_3,_2>_>.
             super_ExprPBase<tcu::Matrix<float,_3,_2>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr;
    (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(&local_b0,pEVar2,ctx);
    pIVar4 = Environment::lookup<tcu::Matrix<float,3,2>>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                                 .m_ptr);
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&(pIVar4->m_data).m_data[0].m_data[0].m_hi + lVar5) =
           *(undefined8 *)((long)&local_b0.m_data.m_data[0].m_data[0].m_hi + lVar5);
      dVar3 = *(double *)((long)&local_b0.m_data.m_data[0].m_data[0].m_lo + lVar5);
      pbVar1 = &(pIVar4->m_data).m_data[0].m_data[0].m_hasNaN + lVar5;
      *(undefined8 *)pbVar1 = *(undefined8 *)(&local_b0.m_data.m_data[0].m_data[0].m_hasNaN + lVar5)
      ;
      *(double *)(pbVar1 + 8) = dVar3;
      dVar3 = *(double *)((long)&local_b0.m_data.m_data[1].m_data[0].m_lo + lVar5);
      pbVar1 = &(pIVar4->m_data).m_data[1].m_data[0].m_hasNaN + lVar5;
      *(undefined8 *)pbVar1 = *(undefined8 *)(&local_b0.m_data.m_data[1].m_data[0].m_hasNaN + lVar5)
      ;
      *(double *)(pbVar1 + 8) = dVar3;
      *(undefined8 *)((long)&(pIVar4->m_data).m_data[1].m_data[0].m_hi + lVar5) =
           *(undefined8 *)((long)&local_b0.m_data.m_data[1].m_data[0].m_hi + lVar5);
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x48);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}